

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O0

void SerializeToVector<DataStream,ParamsWrapper<TransactionSerParams,std::shared_ptr<CTransaction_const>const>>
               (DataStream *s,
               ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_> *args
               )

{
  DataStream *in_RDI;
  long in_FS_OFFSET;
  SizeComputer sizecomp;
  DataStream *in_stack_ffffffffffffffc8;
  undefined1 *nSize;
  undefined1 local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  nSize = local_10;
  SizeComputer::SizeComputer((SizeComputer *)in_stack_ffffffffffffffc8);
  SerializeMany<SizeComputer,ParamsWrapper<TransactionSerParams,std::shared_ptr<CTransaction_const>const>>
            ((SizeComputer *)in_stack_ffffffffffffffc8,
             (ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_> *)
             0x5a5dce);
  SizeComputer::size((SizeComputer *)in_stack_ffffffffffffffc8);
  WriteCompactSize<DataStream>(in_RDI,(uint64_t)nSize);
  SerializeMany<DataStream,ParamsWrapper<TransactionSerParams,std::shared_ptr<CTransaction_const>const>>
            (in_stack_ffffffffffffffc8,
             (ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_> *)
             0x5a5dfe);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeToVector(Stream& s, const X&... args)
{
    SizeComputer sizecomp;
    SerializeMany(sizecomp, args...);
    WriteCompactSize(s, sizecomp.size());
    SerializeMany(s, args...);
}